

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O1

_Bool fs_stdio_filename_exists(char *path)

{
  int iVar1;
  int *piVar2;
  WRAP_STAT_TYPE st;
  stat sStack_98;
  
  iVar1 = stat(path,&sStack_98);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 2) {
      al_set_errno(*piVar2);
    }
  }
  return iVar1 == 0;
}

Assistant:

static bool fs_stdio_filename_exists(const char *path)
{
   WRAP_STAT_TYPE st;
   bool ret = false;
   ASSERT(path);

#ifdef ALLEGRO_WINDOWS
   {
      /* Pass an path created by _wfullpath() to avoid issues
       * with stat() failing when there is a trailing slash.
       */
      wchar_t *abs_path = make_absolute_path(path);
      if (abs_path) {
         ret = (0 == WRAP_STAT(abs_path, &st));
         if (!ret && errno != ENOENT) {
            al_set_errno(errno);
         }
         free(abs_path);
      }
   }
#else
   ret = (0 == WRAP_STAT(path, &st));
   if (!ret && errno != ENOENT) {
      al_set_errno(errno);
   }
#endif

   return ret;
}